

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_debug_line_section.cpp
# Opt level: O3

void __thiscall DebugLineSection_RoundTrip_Test::TestBody(DebugLineSection_RoundTrip_Test *this)

{
  array<unsigned_char,_128UL> *__s;
  undefined1 auVar1 [16];
  database *db;
  char *pcVar2;
  uint8_t alignment;
  type *dls;
  shared_ptr<const_pstore::repo::fragment> fragment;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  extent<unsigned_char> header_extent;
  digest header_digest;
  transaction_type transaction;
  AssertHelper local_1b0;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  uchar local_191;
  container<unsigned_char> local_190;
  debug_line_section *local_180;
  undefined1 local_178 [8];
  bool local_170;
  undefined7 uStack_16f;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  local_168;
  extent<unsigned_char> local_148;
  uint128 local_138;
  transaction<std::unique_lock<mock_mutex>_> local_128;
  section_content local_f0;
  
  local_190.end_ = local_190.begin_;
  local_191 = '\x04';
  local_138.v_._0_8_ = 0x89abcdef;
  local_138.v_._8_8_ = 0x1234567;
  local_148.addr.a_.a_ = (address)5;
  local_148.size = 7;
  __s = &local_f0.data.small_buffer_;
  local_f0.kind = debug_line;
  local_f0.align = '\x04';
  memset(__s,0,0x98);
  local_f0.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0.data.small_buffer_._M_elems[0] = '\v';
  local_f0.data.small_buffer_._M_elems[1] = '\r';
  local_f0.data.elements_ = 2;
  local_168.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        *)0x0;
  local_168.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        *)0x0;
  local_168.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0.data.buffer_ = __s->_M_elems;
  local_128.super_transaction_base._vptr_transaction_base = (_func_int **)operator_new(0x40);
  *(undefined1 *)(local_128.super_transaction_base._vptr_transaction_base + 1) = 0xe;
  *local_128.super_transaction_base._vptr_transaction_base =
       (_func_int *)&PTR__section_creation_dispatcher_0019cd88;
  local_128.super_transaction_base._vptr_transaction_base[2] = (_func_int *)0x89abcdef;
  local_128.super_transaction_base._vptr_transaction_base[3] = (_func_int *)0x1234567;
  local_128.super_transaction_base._vptr_transaction_base[4] = (_func_int *)0x5;
  local_128.super_transaction_base._vptr_transaction_base[5] = (_func_int *)0x7;
  local_128.super_transaction_base._vptr_transaction_base[6] = (_func_int *)&local_f0;
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
  ::_M_realloc_insert<pstore::repo::debug_line_section_creation_dispatcher*>
            ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
              *)&local_168,(iterator)0x0,(debug_line_section_creation_dispatcher **)&local_128);
  local_178 = (undefined1  [8])&(this->super_DebugLineSection).field_0x10;
  local_170 = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_178);
  db = &(this->super_DebugLineSection).db_;
  local_170 = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_128,db,(lock_type *)local_178);
  _local_1a8 = pstore::repo::fragment::
               alloc<pstore::transaction<std::unique_lock<mock_mutex>>,pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
                         (&local_128,
                          (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                           )local_168.
                            super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                           )local_168.
                            super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
  pstore::repo::fragment::load((fragment *)local_178,db,(extent<pstore::repo::fragment> *)local_1a8)
  ;
  pstore::transaction_base::commit(&local_128.super_transaction_base);
  if ((*(byte *)((long)local_178 + 0x11) & 0x40) == 0) {
    local_180 = (debug_line_section *)0x0;
  }
  else {
    local_180 = pstore::repo::fragment::
                at_impl<(pstore::repo::section_kind)14,pstore::repo::fragment_const&,pstore::repo::debug_line_section_const>
                          ((fragment *)local_178);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_190.end_;
  local_190 = (container<unsigned_char>)(auVar1 << 0x40);
  testing::internal::CmpHelperNE<pstore::repo::debug_line_section_const*,decltype(nullptr)>
            ((internal *)local_1a8,"dls","nullptr",&local_180,&local_190.begin_);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_190);
    if (local_1a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1a0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_debug_line_section.cpp"
               ,0x53,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_190);
  }
  else {
    if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1a8 + 8),local_1a0);
    }
    local_190.begin_._0_4_ = 1 << (*(byte *)&(local_180->g_).field_0 & 0x1f);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_char>
              ((internal *)local_1a8,"dls->align ()","alignment",(uint *)&local_190,&local_191);
    if (local_1a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_190);
      if (local_1a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_1a0;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_debug_line_section.cpp"
                 ,0x54,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      if ((long *)local_190.begin_ != (long *)0x0) {
        (**(code **)(*(long *)local_190.begin_ + 8))();
      }
    }
    if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1a8 + 8),local_1a0);
    }
    testing::internal::CmpHelperEQ<pstore::uint128,pstore::uint128>
              ((internal *)local_1a8,"dls->header_digest ()","header_digest",
               &local_180->header_digest_,&local_138);
    if (local_1a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_190);
      if (local_1a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_1a0;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_debug_line_section.cpp"
                 ,0x55,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      if ((long *)local_190.begin_ != (long *)0x0) {
        (**(code **)(*(long *)local_190.begin_ + 8))();
      }
    }
    if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1a8 + 8),local_1a0);
    }
    testing::internal::CmpHelperEQ<pstore::extent<unsigned_char>,pstore::extent<unsigned_char>>
              ((internal *)local_1a8,"dls->header_extent ()","header_extent",&local_180->header_,
               &local_148);
    if (local_1a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_190);
      if (local_1a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)local_1a0;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_debug_line_section.cpp"
                 ,0x56,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      if ((long *)local_190.begin_ != (long *)0x0) {
        (**(code **)(*(long *)local_190.begin_ + 8))();
      }
    }
    if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1a8 + 8),local_1a0);
    }
    local_1b0.data_._0_2_ = 0xb0d;
    local_190 = pstore::repo::generic_section::payload(&local_180->g_);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<unsigned_char,unsigned_char>>>
    ::operator()(local_1a8,(char *)&local_1b0,(container<unsigned_char> *)"dls->payload ()");
    if (local_1a8[0] != (internal)0x0) goto LAB_00114f48;
    testing::Message::Message((Message *)&local_190);
    if (local_1a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1a0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_debug_line_section.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_190);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_1b0);
  if ((long *)local_190.begin_ != (long *)0x0) {
    (**(code **)(*(long *)local_190.begin_ + 8))();
  }
LAB_00114f48:
  if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1a8 + 8),local_1a0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_16f,local_170) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_16f,local_170));
  }
  local_128.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0019a838
  ;
  pstore::transaction_base::rollback(&local_128.super_transaction_base);
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector(&local_168);
  if (local_f0.xfixups.
      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.xfixups.
                    super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.xfixups.
                          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.ifixups.
      super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.ifixups.
                    super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.ifixups.
                          super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.data.big_buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.data.big_buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.data.big_buffer_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F (DebugLineSection, RoundTrip) {
    using pstore::repo::debug_line_section_creation_dispatcher;

    constexpr auto section_type = pstore::repo::section_kind::debug_line;
    constexpr auto alignment = std::uint8_t{4};
    constexpr auto header_digest = pstore::index::digest{0x01234567U, 0x89ABCDEF};
    constexpr auto header_extent =
        pstore::make_extent (pstore::typed_address<std::uint8_t>::make (5), 7);

    pstore::repo::section_content content{section_type, alignment};
    content.data.emplace_back (std::uint8_t{11});
    content.data.emplace_back (std::uint8_t{13});

    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    dispatchers.emplace_back (
        new debug_line_section_creation_dispatcher (header_digest, header_extent, &content));

    transaction_type transaction = begin (db_, lock_guard{mutex_});
    auto fragment = pstore::repo::fragment::load (
        db_, pstore::repo::fragment::alloc (transaction,
                                            pstore::make_pointee_adaptor (dispatchers.begin ()),
                                            pstore::make_pointee_adaptor (dispatchers.end ())));
    transaction.commit ();

    auto const * const dls = fragment->atp<section_type> ();
    ASSERT_NE (dls, nullptr);
    EXPECT_EQ (dls->align (), alignment);
    EXPECT_EQ (dls->header_digest (), header_digest);
    EXPECT_EQ (dls->header_extent (), header_extent);
    EXPECT_THAT (dls->payload (), testing::ElementsAre (std::uint8_t{11}, std::uint8_t{13}));
}